

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ShaderStorageBufferObjectBase::ValidateWindow4Quads
          (ShaderStorageBufferObjectBase *this,vec3 *lb,vec3 *rb,vec3 *rt,vec3 *lt,int *bad_pixels)

{
  float *pfVar1;
  pointer pVVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  vec4 *epsilon;
  int y_1;
  uint uVar6;
  long lVar7;
  long lVar8;
  int x;
  long lVar9;
  ulong uVar10;
  int y_4;
  int y;
  ulong uVar11;
  undefined1 auVar12 [16];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  undefined1 local_68 [16];
  uint *local_58;
  vec3 *local_50;
  vec3 *local_48;
  Vector<float,_3> local_3c;
  
  local_58 = (uint *)bad_pixels;
  local_50 = lt;
  local_48 = rt;
  iVar5 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  auVar12._0_4_ = (float)(int)(float)(*(int *)(lVar7 + 8) * 0x800000 + 0x3f800000);
  auVar12._4_4_ = (float)(int)(float)(*(int *)(lVar7 + 0xc) * 0x800000 + 0x3f800000);
  auVar12._8_4_ = (float)(int)(float)(*(int *)(lVar7 + 0x10) * 0x800000 + 0x3f800000);
  auVar12._12_4_ = (float)(int)(float)(*(int *)(lVar7 + 0x14) * 0x800000 + 0x3f800000);
  local_68 = divps(_DAT_01675840,auVar12);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&fb,10000,(allocator_type *)&local_3c);
  uVar6 = 0;
  epsilon = (vec4 *)fb.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,100,100,0x1907,
             0x1406,fb.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  bVar3 = true;
  lVar7 = 0x2f58;
  for (uVar11 = 10; uVar11 != 0x28; uVar11 = uVar11 + 1) {
    lVar8 = lVar7;
    for (lVar9 = -0x1e;
        pVVar2 = fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start, lVar9 != 0; lVar9 = lVar9 + 1) {
      bVar4 = ColorEqual((ShaderStorageBufferObjectBase *)
                         ((long)(fb.
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8),lb,
                         (vec3 *)local_68,epsilon);
      if (!bVar4) {
        anon_unknown_0::Output
                  ("First bad color (%d, %d): %f %f %f\n",
                   (double)*(float *)((long)pVVar2->m_data + lVar8),
                   (double)*(float *)((long)pVVar2->m_data + lVar8 + 4),
                   (double)*(float *)((long)pVVar2->m_data + lVar8 + 8),(ulong)((int)lVar9 + 0x28),
                   uVar11 & 0xffffffff);
        uVar6 = uVar6 + 1;
        bVar3 = false;
      }
      lVar8 = lVar8 + 0xc;
    }
    lVar7 = lVar7 + 0x4b0;
  }
  if (!bVar3) {
    anon_unknown_0::Output("Left-bottom quad checking failed. Bad pixels: %d",(ulong)uVar6);
  }
  lVar7 = 0x31b0;
  for (uVar11 = 10; uVar11 != 0x28; uVar11 = uVar11 + 1) {
    lVar8 = lVar7;
    for (lVar9 = -0x1e;
        pVVar2 = fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start, lVar9 != 0; lVar9 = lVar9 + 1) {
      bVar4 = ColorEqual((ShaderStorageBufferObjectBase *)
                         ((long)(fb.
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8),rb,
                         (vec3 *)local_68,epsilon);
      if (!bVar4) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",
                   (double)*(float *)((long)pVVar2->m_data + lVar8),
                   (double)*(float *)((long)pVVar2->m_data + lVar8 + 4),
                   (double)*(float *)((long)pVVar2->m_data + lVar8 + 8),(ulong)((int)lVar9 + 0x5a),
                   uVar11 & 0xffffffff);
        uVar6 = uVar6 + 1;
        bVar3 = false;
      }
      lVar8 = lVar8 + 0xc;
    }
    lVar7 = lVar7 + 0x4b0;
  }
  if (bVar3 == false) {
    anon_unknown_0::Output("right-bottom quad checking failed. Bad pixels: %d",(ulong)uVar6);
  }
  lVar7 = 0x11c10;
  for (uVar11 = 0x3c; uVar11 != 0x5a; uVar11 = uVar11 + 1) {
    lVar8 = lVar7;
    for (lVar9 = -0x1e;
        pVVar2 = fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start, lVar9 != 0; lVar9 = lVar9 + 1) {
      bVar4 = ColorEqual((ShaderStorageBufferObjectBase *)
                         ((long)(fb.
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8),
                         local_48,(vec3 *)local_68,epsilon);
      if (!bVar4) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",
                   (double)*(float *)((long)pVVar2->m_data + lVar8),
                   (double)*(float *)((long)pVVar2->m_data + lVar8 + 4),
                   (double)*(float *)((long)pVVar2->m_data + lVar8 + 8),(ulong)((int)lVar9 + 0x5a),
                   uVar11 & 0xffffffff);
        uVar6 = uVar6 + 1;
        bVar3 = false;
      }
      lVar8 = lVar8 + 0xc;
    }
    lVar7 = lVar7 + 0x4b0;
  }
  if (bVar3 == false) {
    anon_unknown_0::Output("right-top quad checking failed. Bad pixels: %d",(ulong)uVar6);
  }
  lVar7 = 0x119b8;
  for (uVar11 = 0x3c; uVar11 != 0x5a; uVar11 = uVar11 + 1) {
    lVar8 = lVar7;
    for (lVar9 = -0x1e;
        pVVar2 = fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start, lVar9 != 0; lVar9 = lVar9 + 1) {
      bVar4 = ColorEqual((ShaderStorageBufferObjectBase *)
                         ((long)(fb.
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8),
                         local_50,(vec3 *)local_68,epsilon);
      if (!bVar4) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",
                   (double)*(float *)((long)pVVar2->m_data + lVar8),
                   (double)*(float *)((long)pVVar2->m_data + lVar8 + 4),
                   (double)*(float *)((long)pVVar2->m_data + lVar8 + 8),(ulong)((int)lVar9 + 0x28),
                   uVar11 & 0xffffffff);
        uVar6 = uVar6 + 1;
        bVar3 = false;
      }
      lVar8 = lVar8 + 0xc;
    }
    lVar7 = lVar7 + 0x4b0;
  }
  if (bVar3 == false) {
    anon_unknown_0::Output("left-top quad checking failed. Bad pixels: %d",(ulong)uVar6);
  }
  lVar7 = 0xe100;
  for (uVar11 = 0x30; uVar11 != 0x34; uVar11 = uVar11 + 1) {
    lVar9 = lVar7;
    for (uVar10 = 0; uVar10 != 100; uVar10 = uVar10 + 1) {
      pfVar1 = (fb.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->m_data;
      tcu::Vector<float,_3>::Vector(&local_3c,0.0);
      bVar4 = ColorEqual((ShaderStorageBufferObjectBase *)((long)pfVar1 + lVar9),&local_3c,
                         (vec3 *)local_68,epsilon);
      if (!bVar4) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",
                   (double)*(float *)((long)(fb.
                                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                     lVar9),
                   (double)*(float *)((long)(fb.
                                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                     lVar9 + 4),
                   (double)*(float *)((long)(fb.
                                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                     lVar9 + 8),uVar10 & 0xffffffff,uVar11 & 0xffffffff);
        uVar6 = uVar6 + 1;
        bVar3 = false;
      }
      lVar9 = lVar9 + 0xc;
    }
    lVar7 = lVar7 + 0x4b0;
  }
  if (bVar3 == false) {
    anon_unknown_0::Output("middle horizontal line checking failed. Bad pixels: %d",(ulong)uVar6);
  }
  lVar7 = 0x240;
  for (uVar11 = 0; uVar11 != 100; uVar11 = uVar11 + 1) {
    lVar8 = lVar7;
    for (lVar9 = -4; lVar9 != 0; lVar9 = lVar9 + 1) {
      pfVar1 = (fb.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->m_data;
      tcu::Vector<float,_3>::Vector(&local_3c,0.0);
      bVar4 = ColorEqual((ShaderStorageBufferObjectBase *)((long)pfVar1 + lVar8),&local_3c,
                         (vec3 *)local_68,epsilon);
      if (!bVar4) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",
                   (double)*(float *)((long)(fb.
                                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                     lVar8),
                   (double)*(float *)((long)(fb.
                                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                     lVar8 + 4),
                   (double)*(float *)((long)(fb.
                                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                     lVar8 + 8),(ulong)((int)lVar9 + 0x34),uVar11 & 0xffffffff);
        uVar6 = uVar6 + 1;
        bVar3 = false;
      }
      lVar8 = lVar8 + 0xc;
    }
    lVar7 = lVar7 + 0x4b0;
  }
  if (bVar3 == false) {
    anon_unknown_0::Output("middle vertical line checking failed. Bad pixels: %d",(ulong)uVar6);
  }
  if (local_58 == (uint *)0x0) {
    uVar11 = 0;
  }
  else {
    *local_58 = uVar6;
    uVar11 = (ulong)uVar6;
  }
  anon_unknown_0::Output("Bad pixels:%d, counted bad:%d\n",uVar11,(ulong)uVar6);
  std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
            (&fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)
  ;
  return bVar3;
}

Assistant:

bool ValidateWindow4Quads(const vec3& lb, const vec3& rb, const vec3& rt, const vec3& lt, int* bad_pixels = NULL)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		const int		  width  = 100;
		const int		  height = 100;
		std::vector<vec3> fb(width * height);
		glReadPixels(0, 0, width, height, GL_RGB, GL_FLOAT, &fb[0]);

		bool status = true;
		int  bad	= 0;

		// left-bottom quad
		for (int y = 10; y < height / 2 - 10; ++y)
		{
			for (int x = 10; x < width / 2 - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], lb, g_color_eps))
				{
					Output("First bad color (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("Left-bottom quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// right-bottom quad
		for (int y = 10; y < height / 2 - 10; ++y)
		{
			for (int x = width / 2 + 10; x < width - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], rb, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("right-bottom quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// right-top quad
		for (int y = height / 2 + 10; y < height - 10; ++y)
		{
			for (int x = width / 2 + 10; x < width - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], rt, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("right-top quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// left-top quad
		for (int y = height / 2 + 10; y < height - 10; ++y)
		{
			for (int x = 10; x < width / 2 - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], lt, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("left-top quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// middle horizontal line should be black
		for (int y = height / 2 - 2; y < height / 2 + 2; ++y)
		{
			for (int x = 0; x < width; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], vec3(0), g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("middle horizontal line checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// middle vertical line should be black
		for (int y = 0; y < height; ++y)
		{
			for (int x = width / 2 - 2; x < width / 2 + 2; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], vec3(0), g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("middle vertical line checking failed. Bad pixels: %d", bad);
			//return status;
		}

		if (bad_pixels)
			*bad_pixels = bad;
		Output("Bad pixels:%d, counted bad:%d\n", bad_pixels == NULL ? 0 : *bad_pixels, bad);
		return status;
	}